

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfLut.cpp
# Opt level: O2

void __thiscall Imf_3_4::HalfLut::apply(HalfLut *this,Slice *data,Box2i *dataWindow)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  half *phVar8;
  ushort *puVar9;
  int y;
  int iVar10;
  char *pcVar11;
  int x;
  int iVar12;
  
  sVar6 = data->xStride;
  sVar7 = data->yStride;
  iVar1 = (dataWindow->min).x;
  iVar10 = (dataWindow->min).y;
  iVar2 = data->ySampling;
  pcVar11 = data->base + (long)(iVar10 / iVar2) * sVar7;
  iVar3 = (dataWindow->max).y;
  iVar4 = data->xSampling;
  iVar5 = (dataWindow->max).x;
  for (; iVar10 <= iVar3; iVar10 = iVar10 + iVar2) {
    puVar9 = (ushort *)(pcVar11 + (long)(iVar1 / iVar4) * sVar6);
    phVar8 = (this->_lut)._lut;
    for (iVar12 = iVar1; iVar12 <= iVar5; iVar12 = iVar12 + iVar4) {
      *puVar9 = phVar8[*puVar9]._h;
      puVar9 = (ushort *)((long)puVar9 + sVar6);
    }
    pcVar11 = pcVar11 + sVar7;
  }
  return;
}

Assistant:

void
HalfLut::apply (
    const Slice& data, const IMATH_NAMESPACE::Box2i& dataWindow) const
{
    assert (data.type == HALF);
    assert (dataWindow.min.x % data.xSampling == 0);
    assert (dataWindow.min.y % data.ySampling == 0);
    assert ((dataWindow.max.x - dataWindow.min.x + 1) % data.xSampling == 0);
    assert ((dataWindow.max.y - dataWindow.min.y + 1) % data.ySampling == 0);

    char* base = data.base + data.yStride * (dataWindow.min.y / data.ySampling);

    for (int y = dataWindow.min.y; y <= dataWindow.max.y; y += data.ySampling)
    {
        char* pixel = base + data.xStride * (dataWindow.min.x / data.xSampling);

        for (int x = dataWindow.min.x; x <= dataWindow.max.x;
             x += data.xSampling)
        {
            *(half*) pixel = _lut (*(half*) pixel);
            pixel += data.xStride;
        }

        base += data.yStride;
    }
}